

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyLoader.cpp
# Opt level: O0

void __thiscall
Assimp::PLYImporter::LoadFace
          (PLYImporter *this,Element *pcElement,ElementInstance *instElement,uint pos)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  DeadlyImportError *this_00;
  reference pPVar8;
  ulong uVar9;
  ulong *puVar10;
  PropertyInstance *pPVar11;
  size_type sVar12;
  ulong uVar13;
  uint *puVar14;
  reference pVVar15;
  aiVector3D *paVar16;
  aiFace *paVar17;
  ulong uVar18;
  float fVar19;
  aiFace *local_1a0;
  aiVector3t<float> *local_178;
  aiFace *local_150;
  const_iterator cStack_110;
  int p_2;
  __normal_iterator<const_Assimp::PLY::PropertyInstance::ValueUnion_*,_std::vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>_>
  local_108;
  const_iterator a_4;
  int aiTable [2];
  vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
  *quak;
  bool flip;
  uint local_d4;
  uint vindex;
  uint a_3;
  const_iterator p_1;
  uint iNum_1;
  uint local_b4;
  const_iterator cStack_b0;
  uint a_2;
  const_iterator p;
  const_iterator cStack_a0;
  uint iNum;
  __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
  local_98;
  const_iterator a_1;
  const_iterator cStack_88;
  uint _a_1;
  __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
  local_80;
  const_iterator a;
  uint _a;
  EDataType eType3;
  uint iTextureCoord;
  uint uStack_64;
  bool bIsTriStrip;
  EDataType eType;
  uint iProperty;
  bool bOne;
  allocator<char> local_49;
  string local_48;
  uint local_24;
  ElementInstance *pEStack_20;
  uint pos_local;
  ElementInstance *instElement_local;
  Element *pcElement_local;
  PLYImporter *this_local;
  
  local_24 = pos;
  pEStack_20 = instElement;
  instElement_local = (ElementInstance *)pcElement;
  pcElement_local = (Element *)this;
  if (pcElement == (Element *)0x0) {
    __assert_fail("nullptr != pcElement",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyLoader.cpp"
                  ,0x1fd,
                  "void Assimp::PLYImporter::LoadFace(const PLY::Element *, const PLY::ElementInstance *, unsigned int)"
                 );
  }
  if (instElement == (ElementInstance *)0x0) {
    __assert_fail("nullptr != instElement",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyLoader.cpp"
                  ,0x1fe,
                  "void Assimp::PLYImporter::LoadFace(const PLY::Element *, const PLY::ElementInstance *, unsigned int)"
                 );
  }
  if (this->mGeneratedMesh == (aiMesh *)0x0) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Invalid .ply file: Vertices should be declared before faces",
               &local_49);
    DeadlyImportError::DeadlyImportError(this_00,&local_48);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  bVar6 = false;
  uStack_64 = 0xffffffff;
  iTextureCoord = 0;
  bVar5 = false;
  _a = 0xffffffff;
  a._M_current._4_4_ = EDT_Char;
  if (pcElement->eSemantic == EEST_Face) {
    a._M_current._0_4_ = 0;
    local_80._M_current =
         (Property *)
         std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>::begin
                   (&pcElement->alProperties);
    while( true ) {
      cStack_88 = std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>::end
                            ((vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>
                              *)instElement_local);
      bVar4 = __gnu_cxx::operator!=(&local_80,&stack0xffffffffffffff78);
      if (!bVar4) break;
      pPVar8 = __gnu_cxx::
               __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
               ::operator*(&local_80);
      if (pPVar8->Semantic == EST_VertexIndex) {
        pPVar8 = __gnu_cxx::
                 __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                 ::operator*(&local_80);
        if ((pPVar8->bIsList & 1U) != 0) {
          uStack_64 = (uint)a._M_current;
          bVar6 = true;
          pPVar8 = __gnu_cxx::
                   __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                   ::operator*(&local_80);
          iTextureCoord = pPVar8->eType;
        }
      }
      else {
        pPVar8 = __gnu_cxx::
                 __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                 ::operator*(&local_80);
        if ((pPVar8->Semantic == EST_TextureCoordinates) &&
           (pPVar8 = __gnu_cxx::
                     __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                     ::operator*(&local_80), (pPVar8->bIsList & 1U) != 0)) {
          _a = (uint)a._M_current;
          bVar6 = true;
          pPVar8 = __gnu_cxx::
                   __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                   ::operator*(&local_80);
          a._M_current._4_4_ = pPVar8->eType;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
      ::operator++(&local_80);
      a._M_current._0_4_ = (uint)a._M_current + 1;
    }
  }
  else if (pcElement->eSemantic == EEST_TriStrip) {
    a_1._M_current._4_4_ = 0;
    local_98._M_current =
         (Property *)
         std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>::begin
                   (&pcElement->alProperties);
    while( true ) {
      cStack_a0 = std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>::end
                            ((vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>
                              *)instElement_local);
      bVar4 = __gnu_cxx::operator!=(&local_98,&stack0xffffffffffffff60);
      if (!bVar4) break;
      pPVar8 = __gnu_cxx::
               __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
               ::operator*(&local_98);
      if ((pPVar8->bIsList & 1U) != 0) {
        uStack_64 = a_1._M_current._4_4_;
        bVar6 = true;
        bVar5 = true;
        pPVar8 = __gnu_cxx::
                 __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                 ::operator*(&local_98);
        iTextureCoord = pPVar8->eType;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
      ::operator++(&local_98);
      a_1._M_current._4_4_ = a_1._M_current._4_4_ + 1;
    }
  }
  if (bVar6) {
    if (this->mGeneratedMesh->mFaces == (aiFace *)0x0) {
      this->mGeneratedMesh->mNumFaces =
           *(uint *)&instElement_local[2].alProperties.
                     super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      uVar13 = CONCAT44(0,this->mGeneratedMesh->mNumFaces);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar13;
      uVar9 = SUB168(auVar1 * ZEXT816(0x10),0);
      uVar18 = uVar9 + 8;
      if (SUB168(auVar1 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar9) {
        uVar18 = 0xffffffffffffffff;
      }
      puVar10 = (ulong *)operator_new__(uVar18);
      *puVar10 = uVar13;
      paVar17 = (aiFace *)(puVar10 + 1);
      if (uVar13 != 0) {
        local_150 = paVar17;
        do {
          aiFace::aiFace(local_150);
          local_150 = local_150 + 1;
        } while (local_150 != paVar17 + uVar13);
      }
      this->mGeneratedMesh->mFaces = paVar17;
    }
    if (bVar5) {
      bVar6 = false;
      pPVar11 = anon_unknown.dwarf_7bd600::GetProperty<Assimp::PLY::PropertyInstance>
                          (&pEStack_20->alProperties,uStack_64);
      a_4._M_current = (ValueUnion *)0xffffffffffffffff;
      local_108._M_current =
           (ValueUnion *)
           std::
           vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
           ::begin(&pPVar11->avList);
      while( true ) {
        cStack_110 = std::
                     vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                     ::end(&pPVar11->avList);
        bVar5 = __gnu_cxx::operator!=(&local_108,&stack0xfffffffffffffef0);
        if (!bVar5) break;
        pVVar15 = __gnu_cxx::
                  __normal_iterator<const_Assimp::PLY::PropertyInstance::ValueUnion_*,_std::vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>_>
                  ::operator*(&local_108);
        uVar7 = PLY::PropertyInstance::ConvertTo<int>(*pVVar15,iTextureCoord);
        if (uVar7 == 0xffffffff) {
          a_4._M_current = (ValueUnion *)0xffffffffffffffff;
          bVar6 = false;
        }
        else if ((uint)a_4._M_current == -1) {
          a_4._M_current._0_4_ = uVar7;
        }
        else if (a_4._M_current._4_4_ == -1) {
          a_4._M_current._4_4_ = uVar7;
        }
        else {
          if (this->mGeneratedMesh->mFaces == (aiFace *)0x0) {
            this->mGeneratedMesh->mNumFaces =
                 *(uint *)&instElement_local[2].alProperties.
                           super__Vector_base<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
            uVar13 = CONCAT44(0,this->mGeneratedMesh->mNumFaces);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = uVar13;
            uVar9 = SUB168(auVar3 * ZEXT816(0x10),0);
            uVar18 = uVar9 + 8;
            if (SUB168(auVar3 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar9) {
              uVar18 = 0xffffffffffffffff;
            }
            puVar10 = (ulong *)operator_new__(uVar18);
            *puVar10 = uVar13;
            paVar17 = (aiFace *)(puVar10 + 1);
            if (uVar13 != 0) {
              local_1a0 = paVar17;
              do {
                aiFace::aiFace(local_1a0);
                local_1a0 = local_1a0 + 1;
              } while (local_1a0 != paVar17 + uVar13);
            }
            this->mGeneratedMesh->mFaces = paVar17;
          }
          this->mGeneratedMesh->mFaces[local_24].mNumIndices = 3;
          puVar14 = (uint *)operator_new__(0xc);
          this->mGeneratedMesh->mFaces[local_24].mIndices = puVar14;
          *this->mGeneratedMesh->mFaces[local_24].mIndices = (uint)a_4._M_current;
          this->mGeneratedMesh->mFaces[local_24].mIndices[1] = a_4._M_current._4_4_;
          this->mGeneratedMesh->mFaces[local_24].mIndices[2] = uVar7;
          bVar6 = (bool)(bVar6 ^ 1);
          if (bVar6) {
            std::swap<unsigned_int>
                      (this->mGeneratedMesh->mFaces[local_24].mIndices,
                       this->mGeneratedMesh->mFaces[local_24].mIndices + 1);
          }
          a_4._M_current._0_4_ = a_4._M_current._4_4_;
          a_4._M_current._4_4_ = uVar7;
        }
        __gnu_cxx::
        __normal_iterator<const_Assimp::PLY::PropertyInstance::ValueUnion_*,_std::vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>_>
        ::operator++(&local_108);
      }
    }
    else {
      if (uStack_64 != 0xffffffff) {
        pPVar11 = anon_unknown.dwarf_7bd600::GetProperty<Assimp::PLY::PropertyInstance>
                            (&pEStack_20->alProperties,uStack_64);
        sVar12 = std::
                 vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                 ::size(&pPVar11->avList);
        p._M_current._4_4_ = (uint)sVar12;
        this->mGeneratedMesh->mFaces[local_24].mNumIndices = p._M_current._4_4_;
        uVar13 = SUB168(ZEXT416(p._M_current._4_4_) * ZEXT816(4),0);
        if (SUB168(ZEXT416(p._M_current._4_4_) * ZEXT816(4),8) != 0) {
          uVar13 = 0xffffffffffffffff;
        }
        puVar14 = (uint *)operator_new__(uVar13);
        this->mGeneratedMesh->mFaces[local_24].mIndices = puVar14;
        pPVar11 = anon_unknown.dwarf_7bd600::GetProperty<Assimp::PLY::PropertyInstance>
                            (&pEStack_20->alProperties,uStack_64);
        cStack_b0 = std::
                    vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                    ::begin(&pPVar11->avList);
        local_b4 = 0;
        while (local_b4 < p._M_current._4_4_) {
          pVVar15 = __gnu_cxx::
                    __normal_iterator<const_Assimp::PLY::PropertyInstance::ValueUnion_*,_std::vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>_>
                    ::operator*(&stack0xffffffffffffff50);
          uVar7 = PLY::PropertyInstance::ConvertTo<unsigned_int>(*pVVar15,iTextureCoord);
          this->mGeneratedMesh->mFaces[local_24].mIndices[local_b4] = uVar7;
          local_b4 = local_b4 + 1;
          __gnu_cxx::
          __normal_iterator<const_Assimp::PLY::PropertyInstance::ValueUnion_*,_std::vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>_>
          ::operator++(&stack0xffffffffffffff50);
        }
      }
      if (_a != 0xffffffff) {
        pPVar11 = anon_unknown.dwarf_7bd600::GetProperty<Assimp::PLY::PropertyInstance>
                            (&pEStack_20->alProperties,_a);
        sVar12 = std::
                 vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                 ::size(&pPVar11->avList);
        p_1._M_current._4_4_ = (uint)sVar12;
        pPVar11 = anon_unknown.dwarf_7bd600::GetProperty<Assimp::PLY::PropertyInstance>
                            (&pEStack_20->alProperties,_a);
        _vindex = std::
                  vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                  ::begin(&pPVar11->avList);
        if (p_1._M_current._4_4_ / 3 == 2) {
          local_d4 = 0;
          while (local_d4 < p_1._M_current._4_4_) {
            uVar7 = this->mGeneratedMesh->mFaces[local_24].mIndices[local_d4 >> 1];
            if (uVar7 < this->mGeneratedMesh->mNumVertices) {
              if (this->mGeneratedMesh->mTextureCoords[0] == (aiVector3D *)0x0) {
                this->mGeneratedMesh->mNumUVComponents[0] = 2;
                uVar13 = CONCAT44(0,this->mGeneratedMesh->mNumVertices);
                auVar2._8_8_ = 0;
                auVar2._0_8_ = uVar13;
                uVar9 = SUB168(auVar2 * ZEXT816(0xc),0);
                if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
                  uVar9 = 0xffffffffffffffff;
                }
                paVar16 = (aiVector3D *)operator_new__(uVar9);
                if (uVar13 != 0) {
                  local_178 = paVar16;
                  do {
                    aiVector3t<float>::aiVector3t(local_178);
                    local_178 = local_178 + 1;
                  } while (local_178 != paVar16 + uVar13);
                }
                this->mGeneratedMesh->mTextureCoords[0] = paVar16;
              }
              if ((local_d4 & 1) == 0) {
                pVVar15 = __gnu_cxx::
                          __normal_iterator<const_Assimp::PLY::PropertyInstance::ValueUnion_*,_std::vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>_>
                          ::operator*((__normal_iterator<const_Assimp::PLY::PropertyInstance::ValueUnion_*,_std::vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>_>
                                       *)&vindex);
                fVar19 = PLY::PropertyInstance::ConvertTo<float>(*pVVar15,a._M_current._4_4_);
                this->mGeneratedMesh->mTextureCoords[0][uVar7].x = fVar19;
              }
              else {
                pVVar15 = __gnu_cxx::
                          __normal_iterator<const_Assimp::PLY::PropertyInstance::ValueUnion_*,_std::vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>_>
                          ::operator*((__normal_iterator<const_Assimp::PLY::PropertyInstance::ValueUnion_*,_std::vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>_>
                                       *)&vindex);
                fVar19 = PLY::PropertyInstance::ConvertTo<float>(*pVVar15,a._M_current._4_4_);
                this->mGeneratedMesh->mTextureCoords[0][uVar7].y = fVar19;
              }
              this->mGeneratedMesh->mTextureCoords[0][uVar7].z = 0.0;
            }
            local_d4 = local_d4 + 1;
            __gnu_cxx::
            __normal_iterator<const_Assimp::PLY::PropertyInstance::ValueUnion_*,_std::vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>_>
            ::operator++((__normal_iterator<const_Assimp::PLY::PropertyInstance::ValueUnion_*,_std::vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>_>
                          *)&vindex);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void PLYImporter::LoadFace(const PLY::Element* pcElement, const PLY::ElementInstance* instElement,
        unsigned int pos) {
    ai_assert(nullptr != pcElement);
    ai_assert(nullptr != instElement);

    if (mGeneratedMesh == nullptr) {
        throw DeadlyImportError("Invalid .ply file: Vertices should be declared before faces");
    }

    bool bOne = false;

    // index of the vertex index list
    unsigned int iProperty = 0xFFFFFFFF;
    PLY::EDataType eType = EDT_Char;
    bool bIsTriStrip = false;

    // index of the material index property
    //unsigned int iMaterialIndex = 0xFFFFFFFF;
    //PLY::EDataType eType2 = EDT_Char;

    // texture coordinates
    unsigned int iTextureCoord = 0xFFFFFFFF;
    PLY::EDataType eType3 = EDT_Char;

    // face = unique number of vertex indices
    if (PLY::EEST_Face == pcElement->eSemantic) {
        unsigned int _a = 0;
        for (std::vector<PLY::Property>::const_iterator a = pcElement->alProperties.begin();
                a != pcElement->alProperties.end(); ++a, ++_a) {
            if (PLY::EST_VertexIndex == (*a).Semantic) {
                // must be a dynamic list!
                if (!(*a).bIsList) {
                    continue;
                }

                iProperty = _a;
                bOne = true;
                eType = (*a).eType;
            } else if (PLY::EST_TextureCoordinates == (*a).Semantic) {
                // must be a dynamic list!
                if (!(*a).bIsList) {
                    continue;
                }
                iTextureCoord = _a;
                bOne = true;
                eType3 = (*a).eType;
            }
        }
    }
    // triangle strip
    // TODO: triangle strip and material index support???
    else if (PLY::EEST_TriStrip == pcElement->eSemantic) {
        unsigned int _a = 0;
        for (std::vector<PLY::Property>::const_iterator a = pcElement->alProperties.begin();
                a != pcElement->alProperties.end(); ++a, ++_a) {
            // must be a dynamic list!
            if (!(*a).bIsList) {
                continue;
            }
            iProperty = _a;
            bOne = true;
            bIsTriStrip = true;
            eType = (*a).eType;
            break;
        }
    }

    // check whether we have at least one per-face information set
    if (bOne) {
        if (mGeneratedMesh->mFaces == nullptr) {
            mGeneratedMesh->mNumFaces = pcElement->NumOccur;
            mGeneratedMesh->mFaces = new aiFace[mGeneratedMesh->mNumFaces];
        }

        if (!bIsTriStrip) {
            // parse the list of vertex indices
            if (0xFFFFFFFF != iProperty) {
                const unsigned int iNum = (unsigned int)GetProperty(instElement->alProperties, iProperty).avList.size();
                mGeneratedMesh->mFaces[pos].mNumIndices = iNum;
                mGeneratedMesh->mFaces[pos].mIndices = new unsigned int[iNum];

                std::vector<PLY::PropertyInstance::ValueUnion>::const_iterator p =
                GetProperty(instElement->alProperties, iProperty).avList.begin();

                for (unsigned int a = 0; a < iNum; ++a, ++p) {
                    mGeneratedMesh->mFaces[pos].mIndices[a] = PLY::PropertyInstance::ConvertTo<unsigned int>(*p, eType);
                }
            }

        // parse the material index
        // cannot be handled without processing the whole file first
        /*if (0xFFFFFFFF != iMaterialIndex)
        {
            mGeneratedMesh->mFaces[pos]. = PLY::PropertyInstance::ConvertTo<unsigned int>(
            GetProperty(instElement->alProperties, iMaterialIndex).avList.front(), eType2);
        }*/

            if (0xFFFFFFFF != iTextureCoord) {
                const unsigned int iNum = (unsigned int)GetProperty(instElement->alProperties, iTextureCoord).avList.size();

                //should be 6 coords
                std::vector<PLY::PropertyInstance::ValueUnion>::const_iterator p =
                GetProperty(instElement->alProperties, iTextureCoord).avList.begin();

                if ((iNum / 3) == 2) // X Y coord
                {
                    for (unsigned int a = 0; a < iNum; ++a, ++p) {
                        unsigned int vindex = mGeneratedMesh->mFaces[pos].mIndices[a / 2];
                        if (vindex < mGeneratedMesh->mNumVertices) {
                            if (mGeneratedMesh->mTextureCoords[0] == nullptr ) {
                                mGeneratedMesh->mNumUVComponents[0] = 2;
                                mGeneratedMesh->mTextureCoords[0] = new aiVector3D[mGeneratedMesh->mNumVertices];
                            }

                            if (a % 2 == 0) {
                                mGeneratedMesh->mTextureCoords[0][vindex].x = PLY::PropertyInstance::ConvertTo<ai_real>(*p, eType3);
                            } else {
                                mGeneratedMesh->mTextureCoords[0][vindex].y = PLY::PropertyInstance::ConvertTo<ai_real>(*p, eType3);
                            }

                            mGeneratedMesh->mTextureCoords[0][vindex].z = 0;
                        }
                    }
                }
            }
        } else { // triangle strips
            // normally we have only one triangle strip instance where
            // a value of -1 indicates a restart of the strip
            bool flip = false;
            const std::vector<PLY::PropertyInstance::ValueUnion>& quak = GetProperty(instElement->alProperties, iProperty).avList;
            //pvOut->reserve(pvOut->size() + quak.size() + (quak.size()>>2u)); //Limits memory consumption

            int aiTable[2] = { -1, -1 };
            for (std::vector<PLY::PropertyInstance::ValueUnion>::const_iterator a = quak.begin(); a != quak.end(); ++a)  {
                const int p = PLY::PropertyInstance::ConvertTo<int>(*a, eType);

                if (-1 == p) {
                    // restart the strip ...
                    aiTable[0] = aiTable[1] = -1;
                    flip = false;
                    continue;
                }
                if (-1 == aiTable[0]) {
                    aiTable[0] = p;
                    continue;
                }
                if (-1 == aiTable[1]) {
                    aiTable[1] = p;
                    continue;
                }

                if (mGeneratedMesh->mFaces == nullptr) {
                    mGeneratedMesh->mNumFaces = pcElement->NumOccur;
                    mGeneratedMesh->mFaces = new aiFace[mGeneratedMesh->mNumFaces];
                }

                mGeneratedMesh->mFaces[pos].mNumIndices = 3;
                mGeneratedMesh->mFaces[pos].mIndices = new unsigned int[3];
                mGeneratedMesh->mFaces[pos].mIndices[0] = aiTable[0];
                mGeneratedMesh->mFaces[pos].mIndices[1] = aiTable[1];
                mGeneratedMesh->mFaces[pos].mIndices[2] = p;

                // every second pass swap the indices.
                flip = !flip;
                if ( flip ) {
                    std::swap(mGeneratedMesh->mFaces[pos].mIndices[0], mGeneratedMesh->mFaces[pos].mIndices[1]);
                }

                aiTable[0] = aiTable[1];
                aiTable[1] = p;
            }
        }
    }
}